

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O1

void __thiscall
andres::Partition<unsigned_long>::representativeLabeling
          (Partition<unsigned_long> *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *out)

{
  pointer puVar1;
  mapped_type *pmVar2;
  long lVar3;
  pointer puVar4;
  unsigned_long uVar5;
  mapped_type mVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::clear(&out->_M_t);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_38,this->numberOfSets_,&local_39);
  puVar1 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    uVar5 = 0;
    puVar4 = local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (uVar5 == puVar1[uVar5]) {
        *puVar4 = uVar5;
        puVar4 = puVar4 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != uVar5);
  }
  if (this->numberOfSets_ != 0) {
    lVar3 = 0;
    mVar6 = 0;
    do {
      pmVar2 = std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[](out,(key_type *)
                                ((long)local_38.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar3));
      *pmVar2 = mVar6;
      mVar6 = mVar6 + 1;
      lVar3 = lVar3 + 8;
    } while (mVar6 < this->numberOfSets_);
  }
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void 
Partition<T>::representativeLabeling(
    std::map<Index, Index>& out
) const {
    out.clear();	
    std::vector<Index> r(static_cast<std::size_t>(numberOfSets()));
    representatives(r.begin());
    for(Index j = 0; j < numberOfSets(); ++j) {
        out[r[static_cast<std::size_t>(j)]] = j;
    }
}